

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

wchar_t variance(wchar_t *nums,wchar_t size,_Bool unbiased,_Bool of_mean,my_rational *frac)

{
  _Bool _Var1;
  uint16_t uVar2;
  uint uVar3;
  wchar_t wVar4;
  size_t sVar5;
  long lVar6;
  uint denominator;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  uint16_t sz [2];
  uint16_t q [8];
  uint16_t sn [4];
  uint16_t sp [4];
  uint16_t r0 [8];
  uint16_t w [3];
  uint16_t nm [2];
  uint16_t r1 [6];
  uint16_t r2 [6];
  uint16_t sqs [8];
  uint16_t qcpy [6];
  my_rational part;
  uint16_t ss [6];
  
  if (size < L'\x02') {
    wVar4 = L'\0';
    if (frac != (my_rational *)0x0) {
      frac->n = 0;
      frac->d = 1;
      wVar4 = L'\0';
    }
  }
  else {
    denominator = size - (uint)unbiased;
    uVar8 = 0;
    ss[0] = 0;
    ss[1] = 0;
    ss[2] = 0;
    ss[3] = 0;
    ss[4] = 0;
    ss[5] = 0;
    sp[0] = 0;
    sp[1] = 0;
    sp[2] = 0;
    sp[3] = 0;
    sn[0] = 0;
    sn[1] = 0;
    sn[2] = 0;
    sn[3] = 0;
    do {
      wVar4 = nums[uVar8];
      if (wVar4 != L'\0') {
        if (wVar4 < L'\x01') {
          uVar3 = (wVar4 ^ 0x7fffffffU) + 0x80000001;
          q._0_4_ = uVar3 >> 0x10 | uVar3 * 0x10000;
          uVar2 = addip_u16n(sn,q,4,2);
          if (uVar2 != 0) {
            __assert_fail("carry == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x626,
                          "int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
          }
        }
        else {
          q._0_4_ = (uint)wVar4 >> 0x10 | wVar4 << 0x10;
          uVar2 = addip_u16n(sp,q,4,2);
          if (uVar2 != 0) {
            __assert_fail("carry == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x623,
                          "int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
          }
        }
        _Var1 = mul_u16n(sqs,q,q,4,2,2);
        if (_Var1) {
          __assert_fail("!over",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x628,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
        uVar2 = addip_u16n(ss,sqs,6,4);
        if (uVar2 != 0) {
          __assert_fail("carry == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x629,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
      }
      uVar8 = uVar8 + 1;
    } while ((uint)size != uVar8);
    wVar4 = cmp_u16n(sp,sn,4,4);
    if (wVar4 < L'\0') {
      subip_u16n(sn,sp,4,4);
      _Var1 = mul_u16n(sqs,sn,sn,8,4,4);
      if (_Var1) {
        __assert_fail("!over",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x631,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
    }
    else {
      subip_u16n(sp,sn,4,4);
      _Var1 = mul_u16n(sqs,sp,sp,8,4,4);
      if (_Var1) {
        __assert_fail("!over",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x62e,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
    }
    sz = (uint16_t  [2])((uint)size >> 0x10 | size << 0x10);
    wVar4 = div_u16n(q,r0,w,sqs,sz,8,8,2);
    if (wVar4 != L'\0') {
      __assert_fail("i == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x636,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
    sVar5 = msb_u16n(r0,8);
    if (sVar5 != 0) {
      r1[0] = 0;
      r1[1] = 1;
      addip_u16n(q,r1,8,2);
      unique0x1000047a = (undefined4)(CONCAT24(r0[6],r0._8_4_) >> 0x10);
      r1[0] = r0[0];
      r1[1] = r0[1];
      r1[2] = r0[2];
      r1[3] = r0[3];
      lVar6 = 7;
      uVar8 = (ulong)(uint)size;
      do {
        uVar7 = uVar8;
        r0[lVar6] = (uint16_t)uVar7;
        bVar9 = lVar6 != 0;
        lVar6 = lVar6 + -1;
        uVar8 = uVar7 >> 0x10;
      } while (bVar9);
      if (0xffff < (uint)uVar7) {
        __assert_fail("!over",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x645,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      wVar4 = cmp_u16n(r0,r1,8,8);
      if (wVar4 < L'\x01') {
        __assert_fail("cmp_u16n(r0, tmp, N_ELEMENTS(r0), N_ELEMENTS(tmp)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x646,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      subip_u16n(r0,r1,8,8);
    }
    wVar4 = cmp_u16n(ss,q,6,8);
    if (wVar4 < L'\0') {
      __assert_fail("cmp_u16n(ss, q, N_ELEMENTS(ss), N_ELEMENTS(q)) >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x649,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
    subip_u16n(ss,q,6,8);
    nm = (uint16_t  [2])(denominator >> 0x10 | denominator * 0x10000);
    wVar4 = div_u16n(q,r1,w,ss,nm,6,6,2);
    if (wVar4 != L'\0') {
      __assert_fail("i == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x64e,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
    if (of_mean) {
      qcpy[4] = q[4];
      qcpy[5] = q[5];
      qcpy[2] = q[2];
      qcpy[3] = q[3];
      qcpy[0] = q[0];
      qcpy[1] = q[1];
      wVar4 = div_u16n(q,r2,w,qcpy,sz,6,6,2);
      if (wVar4 != L'\0') {
        __assert_fail("i == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x657,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
    }
    sVar5 = msb_u16n(q,6);
    if ((sVar5 < 0x21) && (-1 < q._8_4_ * 0x10000)) {
      wVar4 = cmp_u16n(sz,r0,2,8);
      if (wVar4 < L'\x01') {
        __assert_fail("cmp_u16n(sz, r0, N_ELEMENTS(sz), N_ELEMENTS(r0)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x66f,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      wVar4 = cmp_u16n(nm,r1,2,6);
      if (wVar4 < L'\x01') {
        __assert_fail("cmp_u16n(nm, r1, N_ELEMENTS(nm), N_ELEMENTS(r1)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x670,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      if ((of_mean) && (wVar4 = cmp_u16n(sz,r2,2,6), wVar4 < L'\x01')) {
        __assert_fail("!of_mean || cmp_u16n(sz, r2, N_ELEMENTS(sz), N_ELEMENTS(r2)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x671,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      qcpy._0_8_ = my_rational_construct(CONCAT22(r0[7],r0[6]) << 0x10 | (uint)r0[7],size);
      part = my_rational_construct(1,denominator);
      r1._8_4_ = stack0xffffffffffffff82;
      qcpy._0_8_ = my_rational_product((my_rational *)qcpy,&part);
      part = my_rational_construct(CONCAT22(r1[4],r1[5]),denominator);
      qcpy._0_8_ = my_rational_sum((my_rational *)qcpy,&part);
      if (of_mean) {
        part = my_rational_construct(1,size);
        qcpy._0_8_ = my_rational_product((my_rational *)qcpy,&part);
        part = my_rational_construct(CONCAT22(r2[4],r2[5]),size);
        qcpy._0_8_ = my_rational_sum((my_rational *)qcpy,&part);
      }
      wVar4 = q._8_4_ * 0x10000 + ((uint)q._8_4_ >> 0x10);
      if (frac == (my_rational *)0x0) {
        return wVar4 + (uint)(wVar4 != L'\x7fffffff' &&
                             SUB84(qcpy._0_8_,4) + 1 >> 1 <= (uint)qcpy._0_8_);
      }
    }
    else {
      wVar4 = L'\x7fffffff';
      if (frac == (my_rational *)0x0) {
        return L'\x7fffffff';
      }
      qcpy._0_4_ = 0;
      qcpy._4_4_ = 1;
    }
    *frac = (my_rational)qcpy._0_8_;
  }
  return wVar4;
}

Assistant:

int variance(const int *nums, int size, bool unbiased, bool of_mean,
		struct my_rational *frac)
{
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
	/* Holds the absolute value of INT_MIN in an unsigned int. */
	unsigned int abs_int_min = (unsigned int)(-(INT_MIN + 1)) + 1;
	/*
	 * The unbiased variance estimator, sum((nums[i] - sum(nums[i]) /
	 * size)^2) / (size - 1), is equivalent to (sum(nums[i]^2) -
	 * (sum(nums[i]))^2 / size) / (size - 1).  Store sum(nums[i]^2) in
	 * ss, the positive contributions to sum(nums[i]) in sp, and the
	 * negative contributions to sum(nums[i]) in sn.
	 */
	uint16_t ss[3 * MP_DIGITS], sp[2 * MP_DIGITS], sn[2 * MP_DIGITS];
	uint16_t sqs[4 * MP_DIGITS];
	uint16_t q[4 * MP_DIGITS], r0[4 * MP_DIGITS], r1[3 * MP_DIGITS];
	uint16_t r2[3 * MP_DIGITS];
	uint16_t sz[MP_DIGITS], nm[MP_DIGITS], w[MP_DIGITS + 1];
	struct my_rational f, part;
	unsigned int var;
	int norm, i;
	/*
	 * Avoid compiler warnings about set but unused variables when
	 * assertions are stripped.
	 */
#ifndef NDEBUG
	bool over;
#define CHECK_OVERFLOW(x) over = x; assert(!over)
	uint16_t carry;
#define CHECK_CARRY(x) carry = x; assert(carry == 0)
#else
#define CHECK_OVERFLOW(x) x
#define CHECK_CARRY(x) x
#endif

	if (size <= 1) {
		if (frac) {
			*frac = my_rational_construct(0, 1);
		}
		return 0;
	}

	norm = size - ((unbiased) ? 1 : 0);
	zer_u16n(ss, N_ELEMENTS(ss));
	zer_u16n(sp, N_ELEMENTS(sp));
	zer_u16n(sn, N_ELEMENTS(sn));

	for (i = 0; i < size; ++i) {
		uint16_t a[MP_DIGITS], a2[2 * MP_DIGITS];

		if (nums[i] == 0) {
			continue;
		}
		if (nums[i] > 0) {
			CHECK_OVERFLOW(ini_u16n(a, N_ELEMENTS(a), nums[i]));
			CHECK_CARRY(addip_u16n(sp, a, N_ELEMENTS(sp), N_ELEMENTS(a)));
		} else if (nums[i] < 0) {
			CHECK_OVERFLOW(ini_u16n(a, N_ELEMENTS(a), abs_int_min - (unsigned int)(nums[i] - INT_MIN)));
			CHECK_CARRY(addip_u16n(sn, a, N_ELEMENTS(sn), N_ELEMENTS(a)));
		}
		CHECK_OVERFLOW(mul_u16n(a2, a, a, N_ELEMENTS(a2), N_ELEMENTS(a), N_ELEMENTS(a)));
		CHECK_CARRY(addip_u16n(ss, a2, N_ELEMENTS(ss), N_ELEMENTS(a2)));
	}

	if (cmp_u16n(sp, sn, N_ELEMENTS(sp), N_ELEMENTS(sn)) >= 0) {
		subip_u16n(sp, sn, N_ELEMENTS(sp), N_ELEMENTS(sn));
		CHECK_OVERFLOW(mul_u16n(sqs, sp, sp, N_ELEMENTS(sqs), N_ELEMENTS(sp), N_ELEMENTS(sp)));
	} else {
		subip_u16n(sn, sp, N_ELEMENTS(sn), N_ELEMENTS(sp));
		CHECK_OVERFLOW(mul_u16n(sqs, sn, sn, N_ELEMENTS(sqs), N_ELEMENTS(sn), N_ELEMENTS(sn)));
	}
	CHECK_OVERFLOW(ini_u16n(sz, N_ELEMENTS(sz), size));
	i = div_u16n(q, r0, w, sqs, sz, N_ELEMENTS(q), N_ELEMENTS(sqs),
		N_ELEMENTS(sz));
	assert(i == 0);
	if (msb_u16n(r0, N_ELEMENTS(r0)) > 0) {
		/*
		 * Since this remainder is subtracted, add one to the
		 * quotient and convert the remainder to size - r0.  That way
		 * later calculations can treat it as a non-negative term, like
		 * the other fractional parts.
		 */
		uint16_t tmp[4 * MP_DIGITS];

		CHECK_OVERFLOW(ini_u16n(tmp, MP_DIGITS, 1));
		addip_u16n(q, tmp, N_ELEMENTS(q), MP_DIGITS);
		for (i = 0; i < (int)(N_ELEMENTS(r0)); ++i) {
			tmp[i] = r0[i];
		}
		CHECK_OVERFLOW(ini_u16n(r0, N_ELEMENTS(r0), size));
		assert(cmp_u16n(r0, tmp, N_ELEMENTS(r0), N_ELEMENTS(tmp)) > 0);
		subip_u16n(r0, tmp, N_ELEMENTS(r0), N_ELEMENTS(tmp));
	}
	assert(cmp_u16n(ss, q, N_ELEMENTS(ss), N_ELEMENTS(q)) >= 0);
	subip_u16n(ss, q, N_ELEMENTS(ss), N_ELEMENTS(q));
	CHECK_OVERFLOW(ini_u16n(nm, N_ELEMENTS(nm), norm));
	i = div_u16n(q, r1, w, ss, nm, 3 * MP_DIGITS, N_ELEMENTS(ss),
		N_ELEMENTS(nm));
	assert(i == 0);
	if (of_mean) {
		uint16_t qcpy[3 * MP_DIGITS];

		for (i = 0; i < (int)(N_ELEMENTS(qcpy)); ++i) {
			qcpy[i] = q[i];
		}
		i = div_u16n(q, r2, w, qcpy, sz, 3 * MP_DIGITS,
			N_ELEMENTS(qcpy), N_ELEMENTS(sz));
		assert(i == 0);
	}
	if (msb_u16n(q, 3 * MP_DIGITS) > CHAR_BIT * sizeof(unsigned int)) {
		/* Variance is greater than UINT_MAX. */
		if (frac) {
			*frac = my_rational_construct(0, 1);
		}
		return INT_MAX;
	}
	var = ext_u16n(q, 3 * MP_DIGITS);
	if (var > INT_MAX) {
		if (frac) {
			*frac = my_rational_construct(0, 1);
		}
		return INT_MAX;
	}
	/*
	 * Account for the fractional part.  If of_mean is false, that is
	 * r1 / norm + r0 / (size * norm).  If of_mean is true,
	 * that is r2 / size + r1 / (size * norm) + r0 /
	 * (size * size * norm).  Since 0 <= r0 < size,
	 * 0 <= r1 < norm, and 0 <= r2 < size, the total of the fractional
	 * terms is greater than or equal to zero and less than one.
	 */
	assert(cmp_u16n(sz, r0, N_ELEMENTS(sz), N_ELEMENTS(r0)) > 0);
	assert(cmp_u16n(nm, r1, N_ELEMENTS(nm), N_ELEMENTS(r1)) > 0);
	assert(!of_mean || cmp_u16n(sz, r2, N_ELEMENTS(sz), N_ELEMENTS(r2)) > 0);
	f = my_rational_construct(ext_u16n(r0, N_ELEMENTS(r0)), size);
	part = my_rational_construct(1, norm);
	f = my_rational_product(&f, &part);
	part = my_rational_construct(ext_u16n(r1, N_ELEMENTS(r1)), norm);
	f = my_rational_sum(&f, &part);
	if (of_mean) {
		part = my_rational_construct(1, size);
		f = my_rational_product(&f, &part);
		part = my_rational_construct(ext_u16n(r2, N_ELEMENTS(r2)), size);
		f = my_rational_sum(&f, &part);
	}
	if (frac) {
		*frac = f;
	} else {
		/* Round to nearest. */
		if (f.n >= (f.d + 1) / 2 && var < INT_MAX) {
			++var;
		}
	}

	return var;
#undef MP_DIGITS
#undef CHECK_CARRY
#undef CHECK_OVERFLOW
}